

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O1

void __thiscall SplayTree<unsigned_long>::erase(SplayTree<unsigned_long> *this,unsigned_long value)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *A;
  Node **ppNVar5;
  
  for (A = this->root; A != (Node *)0x0; A = *(Node **)((long)&A->value + lVar2)) {
    lVar2 = 0x10;
    if ((value <= A->value) && (lVar2 = 8, A->value <= value)) goto LAB_0010413a;
  }
  A = (Node *)0x0;
LAB_0010413a:
  if (A == (Node *)0x0) {
    return;
  }
  splay(this,A);
  pNVar1 = A->left;
  pNVar4 = A->right;
  if (pNVar1 == (Node *)0x0) {
    pNVar3 = A->parent;
    if (pNVar3 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar3->right;
      if (pNVar3->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar3->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar4;
    if (pNVar4 == (Node *)0x0) goto LAB_0010422c;
  }
  else if (pNVar4 == (Node *)0x0) {
    pNVar3 = A->parent;
    if (pNVar3 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar3->right;
      if (pNVar3->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar3->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar1;
    pNVar4 = pNVar1;
  }
  else {
    do {
      pNVar3 = pNVar4;
      pNVar4 = pNVar3->left;
    } while (pNVar3->left != (Node *)0x0);
    pNVar1 = pNVar3->parent;
    if (pNVar1 != A) {
      pNVar4 = pNVar3->right;
      ppNVar5 = &this->root;
      if (pNVar1 != (Node *)0x0) {
        ppNVar5 = &pNVar1->right;
        if (pNVar1->left == pNVar3) {
          ppNVar5 = &pNVar1->left;
        }
      }
      *ppNVar5 = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        pNVar4->parent = pNVar1;
      }
      pNVar1 = A->right;
      pNVar3->right = pNVar1;
      pNVar1->parent = pNVar3;
    }
    pNVar1 = A->parent;
    if (pNVar1 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar1->right;
      if (pNVar1->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar1->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar3;
    pNVar3->parent = pNVar1;
    pNVar4 = A->left;
    pNVar3->left = pNVar4;
  }
  pNVar4->parent = pNVar3;
LAB_0010422c:
  A->left = (Node *)0x0;
  A->right = (Node *)0x0;
  Node::~Node(A);
  operator_delete(A,0x20);
  return;
}

Assistant:

void erase(T value) {
    Node *z = get(value);
    if (!z)
      return;

    splay(z);

    if (!z->left)
      replace(z, z->right);
    else if (!z->right)
      replace(z, z->left);
    else {
      Node *y = z->right;
      while (y->left)
        y = y->left;

      if (y->parent != z) {
        replace(y, y->right);
        y->right = z->right;
        y->right->parent = y;
      }
      replace(z, y);
      y->left = z->left;
      y->left->parent = y;
    }
    z->left = z->right = nullptr;
    delete z;
  }